

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_rlwnm(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *s;
  TCGv_i64 ret;
  TCGv_i64 arg1;
  TCGv_i64 arg1_00;
  uint uVar1;
  TCGTemp *pTVar2;
  TCGTemp *pTVar3;
  uint uVar4;
  TCGv_i32 ret_00;
  TCGv_i32 ret_01;
  ulong local_48;
  
  s = ctx->uc->tcg_ctx;
  uVar1 = ctx->opcode;
  ret = *(TCGv_i64 *)((long)cpu_gpr + (ulong)(uVar1 >> 0xd & 0xf8));
  arg1 = *(TCGv_i64 *)((long)cpu_gpr + (ulong)(uVar1 >> 0x12 & 0xf8));
  arg1_00 = *(TCGv_i64 *)((long)cpu_gpr + (ulong)(uVar1 >> 8 & 0xf8));
  uVar4 = uVar1 >> 6 & 0x1f;
  uVar1 = uVar1 >> 1 & 0x1f;
  local_48 = 0xffffffffffffffff >> ((char)uVar4 + 0x20U & 0x3f);
  if ((uVar1 == 0x1f) ||
     (local_48 = local_48 ^ 0x7fffffffffffffffU >> ((char)uVar1 + 0x20U & 0x3f), uVar4 <= uVar1)) {
    pTVar2 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I32,false);
    ret_00 = (TCGv_i32)((long)pTVar2 - (long)s);
    pTVar3 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I32,false);
    ret_01 = (TCGv_i32)((long)pTVar3 - (long)s);
    tcg_gen_extrl_i64_i32_ppc64(s,ret_00,arg1_00);
    tcg_gen_extrl_i64_i32_ppc64(s,ret_01,arg1);
    tcg_gen_andi_i32_ppc64(s,ret_00,ret_00,0x1f);
    tcg_gen_rotl_i32_ppc64(s,ret_01,ret_01,ret_00);
    tcg_gen_extu_i32_i64_ppc64(s,ret,ret_01);
    tcg_temp_free_internal_ppc64(s,pTVar2);
  }
  else {
    local_48 = ~local_48;
    pTVar2 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
    ret_01 = (TCGv_i32)((long)pTVar2 - (long)s);
    tcg_gen_andi_i64_ppc64(s,(TCGv_i64)ret_01,arg1_00,0x1f);
    tcg_gen_deposit_i64_ppc64(s,ret,arg1,arg1,0x20,0x20);
    tcg_gen_rotl_i64_ppc64(s,ret,ret,(TCGv_i64)ret_01);
  }
  tcg_temp_free_internal_ppc64(s,(TCGTemp *)(ret_01 + (long)s));
  tcg_gen_andi_i64_ppc64(s,ret,ret,local_48);
  if ((ctx->opcode & 1) == 0) {
    return;
  }
  uVar1._0_1_ = ctx->sf_mode;
  uVar1._1_1_ = ctx->has_cfar;
  uVar1._2_1_ = ctx->fpu_enabled;
  uVar1._3_1_ = ctx->altivec_enabled;
  gen_set_Rc0((DisasContext_conflict10 *)(ulong)uVar1,(TCGv_i64)ctx->uc->tcg_ctx);
  return;
}

Assistant:

static void gen_rlwnm(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t_ra = cpu_gpr[rA(ctx->opcode)];
    TCGv t_rs = cpu_gpr[rS(ctx->opcode)];
    TCGv t_rb = cpu_gpr[rB(ctx->opcode)];
    uint32_t mb = MB(ctx->opcode);
    uint32_t me = ME(ctx->opcode);
    target_ulong mask;

#if defined(TARGET_PPC64)
    mb += 32;
    me += 32;
#endif
    mask = MASK(mb, me);

    if (mask <= 0xffffffffu) {
        TCGv_i32 t0 = tcg_temp_new_i32(tcg_ctx);
        TCGv_i32 t1 = tcg_temp_new_i32(tcg_ctx);
        tcg_gen_trunc_tl_i32(tcg_ctx, t0, t_rb);
        tcg_gen_trunc_tl_i32(tcg_ctx, t1, t_rs);
        tcg_gen_andi_i32(tcg_ctx, t0, t0, 0x1f);
        tcg_gen_rotl_i32(tcg_ctx, t1, t1, t0);
        tcg_gen_extu_i32_tl(tcg_ctx, t_ra, t1);
        tcg_temp_free_i32(tcg_ctx, t0);
        tcg_temp_free_i32(tcg_ctx, t1);
    } else {
#if defined(TARGET_PPC64)
        TCGv_i64 t0 = tcg_temp_new_i64(tcg_ctx);
        tcg_gen_andi_i64(tcg_ctx, t0, t_rb, 0x1f);
        tcg_gen_deposit_i64(tcg_ctx, t_ra, t_rs, t_rs, 32, 32);
        tcg_gen_rotl_i64(tcg_ctx, t_ra, t_ra, t0);
        tcg_temp_free_i64(tcg_ctx, t0);
#else
        g_assert_not_reached();
#endif
    }

    tcg_gen_andi_tl(tcg_ctx, t_ra, t_ra, mask);

    if (unlikely(Rc(ctx->opcode) != 0)) {
        gen_set_Rc0(ctx, t_ra);
    }
}